

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printDefun(JSPrinter *this,Ref node)

{
  size_t sVar1;
  Ref *pRVar2;
  ulong uVar3;
  Ref local_38;
  Ref args;
  Ref node_local;
  
  args = node;
  emit(this,"function ");
  pRVar2 = Ref::operator[](&args,1);
  if (pRVar2->inst->type != String) {
LAB_005e7fe6:
    __assert_fail("isString()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0xec,"const char *cashew::Value::getCString()");
  }
  emit(this,(pRVar2->inst->field_1).str.str._M_str);
  maybeSpace(this,'(');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '(';
  pRVar2 = Ref::operator[](&args,2);
  local_38.inst = pRVar2->inst;
  if ((local_38.inst)->type == Array) {
    uVar3 = 0;
    do {
      if (((((local_38.inst)->field_1).arr)->
          super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements <= uVar3) {
        maybeSpace(this,')');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = ')';
        space(this);
        if ((args.inst)->type != Array) break;
        if (((((args.inst)->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>)
            .usedElements != 3) {
          pRVar2 = Ref::operator[](&args,3);
          if (pRVar2->inst->type != Array) break;
          if ((((pRVar2->inst->field_1).arr)->
              super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements != 0) {
            maybeSpace(this,'{');
            ensure(this,1);
            sVar1 = this->used;
            this->used = sVar1 + 1;
            this->buffer[sVar1] = '{';
            this->indent = this->indent + 1;
            newline(this);
            pRVar2 = Ref::operator[](&args,3);
            printStats(this,pRVar2->inst);
            this->indent = this->indent + -1;
            newline(this);
            emit(this,'}');
            newline(this);
            return;
          }
        }
        emit(this,"{}");
        return;
      }
      if (uVar3 != 0) {
        if (this->pretty == true) {
          emit(this,", ");
        }
        else {
          maybeSpace(this,',');
          ensure(this,1);
          sVar1 = this->used;
          this->used = sVar1 + 1;
          this->buffer[sVar1] = ',';
        }
      }
      pRVar2 = Ref::operator[](&local_38,(uint)uVar3);
      if (pRVar2->inst->type != String) goto LAB_005e7fe6;
      emit(this,(pRVar2->inst->field_1).str.str._M_str);
      uVar3 = uVar3 + 1;
    } while ((local_38.inst)->type == Array);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x19a,"size_t cashew::Value::size()");
}

Assistant:

void printDefun(Ref node) {
    emit("function ");
    emit(node[1]->getCString());
    emit('(');
    Ref args = node[2];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      emit(args[i]->getCString());
    }
    emit(')');
    space();
    if (node->size() == 3 || node[3]->size() == 0) {
      emit("{}");
      return;
    }
    emit('{');
    indent++;
    newline();
    printStats(node[3]);
    indent--;
    newline();
    emit('}');
    newline();
  }